

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

bool __thiscall roaring::Roaring64Map::isSubset(Roaring64Map *this,Roaring64Map *r)

{
  bool bVar1;
  const_iterator roaring_iter;
  pair<const_unsigned_int,_roaring::Roaring> *map_entry;
  const_iterator __end2;
  const_iterator __begin2;
  roarings_t *__range2;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffffa8;
  Roaring *in_stack_ffffffffffffffb0;
  _Self local_48;
  _Self local_40;
  reference local_38;
  _Self local_30;
  _Self local_28 [5];
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::end(in_stack_ffffffffffffffa8);
  do {
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) {
      return true;
    }
    local_38 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
               operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                          *)in_stack_ffffffffffffffb0);
    bVar1 = Roaring::isEmpty(in_stack_ffffffffffffffb0);
    if (!bVar1) {
      local_40._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::find(in_stack_ffffffffffffffa8,(key_type *)0x127322);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::cend(in_stack_ffffffffffffffa8);
      bVar1 = std::operator==(&local_40,&local_48);
      if (bVar1) {
        return false;
      }
      in_stack_ffffffffffffffb0 = &local_38->second;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                 0x12736a);
      bVar1 = Roaring::isSubset(in_stack_ffffffffffffffb0,(Roaring *)in_stack_ffffffffffffffa8);
      if (!bVar1) {
        return false;
      }
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
               in_stack_ffffffffffffffb0);
  } while( true );
}

Assistant:

bool isSubset(const Roaring64Map &r) const {
        for (const auto &map_entry : roarings) {
            if (map_entry.second.isEmpty()) {
                continue;
            }
            auto roaring_iter = r.roarings.find(map_entry.first);
            if (roaring_iter == r.roarings.cend())
                return false;
            else if (!map_entry.second.isSubset(roaring_iter->second))
                return false;
        }
        return true;
    }